

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

uint64_t __thiscall fmp4_stream::emsg::size(emsg *this)

{
  return (uint64_t)
         ((this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish +
         (((ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                   (uint)(this->super_full_box).super_box.is_large_ * 8 +
                  (uint)((this->super_full_box).super_box.field_0x62 == '\x01') * 4) +
          (this->scheme_id_uri_)._M_string_length + (this->value_)._M_string_length) -
         (long)(this->message_data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) + 0x1e);
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}